

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O2

void AddCubesToStartingCover(Vec_Wec_t *vEsop)

{
  int iVar1;
  uint Lit;
  Vec_Int_t *pVVar2;
  drow *pdVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int *pVars;
  int *pVarValues;
  ulong uVar7;
  Cube *pC;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = g_CoverInfo.nVarsIn;
  lVar9 = (long)g_CoverInfo.nVarsIn;
  pVars = (int *)malloc(lVar9 << 2);
  pVarValues = (int *)malloc(lVar9 << 2);
  uVar7 = 0;
  uVar8 = 0;
  if (0 < iVar1) {
    uVar8 = (ulong)(uint)iVar1;
  }
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    pVars[uVar7] = (int)uVar7;
  }
  g_CoverInfo.nLiteralsBefore = 0;
  lVar9 = 0;
  while( true ) {
    if (vEsop->nSize <= lVar9) {
      free(pVars);
      free(pVarValues);
      if (g_CoverInfo.nCubesFree + g_CoverInfo.nCubesInUse != g_CoverInfo.nCubesAlloc) {
        __assert_fail("g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exor.c"
                      ,0x27f,"void AddCubesToStartingCover(Vec_Wec_t *)");
      }
      return;
    }
    pVVar2 = vEsop->pArray;
    if (pVVar2[lVar9].nSize < 1) break;
    uVar5 = pVVar2[lVar9].nSize - 1;
    pVVar2[lVar9].nSize = uVar5;
    uVar5 = pVVar2[lVar9].pArray[uVar5];
    uVar7 = (ulong)(uint)g_CoverInfo.nVarsIn;
    if (g_CoverInfo.nVarsIn < 1) {
      uVar7 = 0;
    }
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pVarValues[uVar8] = 3;
    }
    for (lVar10 = 0; lVar10 < pVVar2[lVar9].nSize; lVar10 = lVar10 + 1) {
      Lit = pVVar2[lVar9].pArray[lVar10];
      if ((int)Lit < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf3,"int Abc_LitIsCompl(int)");
      }
      uVar6 = Abc_Lit2Var(Lit);
      pVarValues[uVar6] = 2 - (Lit & 1);
    }
    pC = GetFreeCube();
    pdVar3 = pC->pCubeDataIn;
    if (*pdVar3 != 0) {
      for (lVar10 = 0; lVar10 < g_CoverInfo.nWordsIn; lVar10 = lVar10 + 1) {
        pdVar3[lVar10] = 0;
      }
      for (lVar10 = 0; lVar10 < g_CoverInfo.nWordsOut; lVar10 = lVar10 + 1) {
        pC->pCubeDataOut[lVar10] = 0;
      }
    }
    InsertVarsWithoutClearing(pC,pVars,g_CoverInfo.nVarsIn,pVarValues,~uVar5);
    pC->a = (short)pVVar2[lVar9].nSize;
    pC->z = 1;
    iVar1 = g_CoverInfo.cIDs + 1;
    bVar4 = (byte)g_CoverInfo.cIDs;
    g_CoverInfo.cIDs = iVar1;
    pC->ID = bVar4;
    if (iVar1 == 0x100) {
      g_CoverInfo.cIDs = 1;
    }
    CheckForCloseCubes(pC,1);
    g_CoverInfo.nLiteralsBefore = g_CoverInfo.nLiteralsBefore + pVVar2[lVar9].nSize;
    lVar9 = lVar9 + 1;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
}

Assistant:

void AddCubesToStartingCover( Vec_Wec_t * vEsop )
{
    Vec_Int_t * vCube;
    Cube * pNew;
    int * s_Level2Var;
    int * s_LevelValues;
    int c, i, k, Lit, Out;

    s_Level2Var = ABC_ALLOC( int, g_CoverInfo.nVarsIn );
    s_LevelValues = ABC_ALLOC( int, g_CoverInfo.nVarsIn );

    for ( i = 0; i < g_CoverInfo.nVarsIn; i++ )
        s_Level2Var[i] = i;

    g_CoverInfo.nLiteralsBefore = 0;
    Vec_WecForEachLevel( vEsop, vCube, c )
    {
        // get the output of this cube
        Out = -Vec_IntPop(vCube) - 1;

        // fill in the cube with blanks
        for ( i = 0; i < g_CoverInfo.nVarsIn; i++ )
            s_LevelValues[i] = VAR_ABS;
        Vec_IntForEachEntry( vCube, Lit, k )
        {
            if ( Abc_LitIsCompl(Lit) )
                s_LevelValues[Abc_Lit2Var(Lit)] = VAR_NEG;
            else
                s_LevelValues[Abc_Lit2Var(Lit)] = VAR_POS;
        }

        // get the new cube
        pNew = GetFreeCube();
        // consider the need to clear the cube
        if ( pNew->pCubeDataIn[0] ) // this is a recycled cube
        {
            for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
                pNew->pCubeDataIn[i] = 0;
            for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                pNew->pCubeDataOut[i] = 0;
        }

        InsertVarsWithoutClearing( pNew, s_Level2Var, g_CoverInfo.nVarsIn, s_LevelValues, Out );
        // set literal counts
        pNew->a = Vec_IntSize(vCube);
        pNew->z = 1;
        // set the ID
        pNew->ID = g_CoverInfo.cIDs++;
        // skip through zero-ID
        if ( g_CoverInfo.cIDs == 256 )
            g_CoverInfo.cIDs = 1;

        // add this cube to storage
        CheckForCloseCubes( pNew, 1 );

        g_CoverInfo.nLiteralsBefore += Vec_IntSize(vCube);
    }
    ABC_FREE( s_Level2Var );
    ABC_FREE( s_LevelValues );

    assert ( g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc );
}